

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)

{
  short sVar1;
  sxu16 sVar2;
  int iVar3;
  ushort *puVar4;
  uint *puVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  lhcell *plVar9;
  unqlite_page *puVar10;
  uint *pDest;
  uint uVar11;
  ushort *puVar12;
  uchar *puVar13;
  ushort local_48;
  lhash_kv_engine *local_40;
  
  iVar3 = -0x49;
  if (nAmount <= pPage->nFree) {
    local_40 = pPage->pHash;
    uVar11 = (uint)nAmount;
    if (pPage->nCell < 10) {
      iVar3 = local_40->iPageSize;
      if (iVar3 / 2 <= (int)uVar11) {
        return -0x49;
      }
    }
    else {
      iVar3 = local_40->iPageSize;
    }
    puVar10 = pPage->pRaw;
    local_48 = (pPage->sHdr).iFree;
    puVar4 = (ushort *)0x0;
    do {
      if ((long)iVar3 <= (long)(ulong)local_48) {
        return -0x49;
      }
      puVar12 = (ushort *)(puVar10->zData + local_48);
      local_48 = *puVar12 << 8 | *puVar12 >> 8;
      uVar7 = puVar12[1] << 8 | puVar12[1] >> 8;
      if ((ushort)nAmount <= uVar7) goto LAB_00113009;
      puVar4 = puVar12;
    } while (local_48 != 0);
    puVar4 = (ushort *)(*local_40->pIo->xTmpPage)(local_40->pIo->pHandle);
    plVar9 = pPage->pMaster->pList;
    SyBigEndianPack64((uchar *)(puVar4 + 2),(pPage->sHdr).iSlave);
    pDest = (uint *)(puVar4 + 6);
    puVar5 = (uint *)((long)local_40->iPageSize + (long)puVar4);
    (pPage->sHdr).iOfft = 0;
    for (; plVar9 != (lhcell *)0x0; plVar9 = plVar9->pNext) {
      puVar10 = plVar9->pPage->pRaw;
      if (puVar10->iPage == pPage->pRaw->iPage) {
        if (plVar9->iOvfl == 0) {
          puVar13 = puVar10->zData + (ulong)plVar9->iStart + 0x1a;
        }
        else {
          puVar13 = (uchar *)0x0;
        }
        plVar9->iNext = (pPage->sHdr).iOfft;
        sVar2 = (short)pDest - (short)puVar4;
        plVar9->iStart = sVar2;
        (pPage->sHdr).iOfft = sVar2;
        uVar8 = plVar9->nHash;
        *pDest = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        uVar8 = plVar9->nKey;
        pDest[1] = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        SyBigEndianPack64((uchar *)(pDest + 2),plVar9->nData);
        *(sxu16 *)(pDest + 4) = plVar9->iNext << 8 | plVar9->iNext >> 8;
        SyBigEndianPack64((uchar *)((long)pDest + 0x12),plVar9->iOvfl);
        pDest = (uint *)((long)pDest + 0x1a);
        if (puVar13 != (uchar *)0x0) {
          SyMemcpy(puVar13,pDest,plVar9->nKey + (int)plVar9->nData);
          pDest = (uint *)((long)pDest + (ulong)plVar9->nKey + plVar9->nData);
        }
        if (puVar5 <= pDest) break;
      }
    }
    uVar7 = (short)puVar5 - (short)pDest;
    pPage->nFree = uVar7;
    if ((uVar7 & 0xfffc) == 0) {
      pPage->nFree = 0;
      (pPage->sHdr).iFree = 0;
    }
    else {
      (pPage->sHdr).iFree = (short)pDest - (short)puVar4;
      *(ushort *)pDest = 0;
      *(sxu16 *)((long)pDest + 2) = pPage->nFree << 8 | pPage->nFree >> 8;
    }
    uVar7 = (pPage->sHdr).iOfft;
    *puVar4 = uVar7 << 8 | uVar7 >> 8;
    uVar7 = (pPage->sHdr).iFree;
    puVar4[1] = uVar7 << 8 | uVar7 >> 8;
    SyMemcpy(puVar4,pPage->pRaw->zData,local_40->iPageSize);
    uVar7 = pPage->nFree;
    iVar3 = -0x49;
    if (uVar11 <= uVar7) {
      local_40 = pPage->pHash;
      puVar10 = pPage->pRaw;
      puVar12 = (ushort *)(puVar10->zData + (pPage->sHdr).iFree);
      local_48 = 0;
      puVar4 = (ushort *)0x0;
LAB_00113009:
      uVar8 = (uint)uVar7;
      iVar3 = (*local_40->pIo->xWrite)(puVar10);
      if (iVar3 == 0) {
        puVar13 = pPage->pRaw->zData;
        sVar1 = (short)puVar13;
        uVar7 = (short)puVar12 - sVar1;
        *pOfft = uVar7;
        if ((int)(uVar8 - uVar11) < 4 || uVar8 < uVar11) {
          nAmount = (sxu64)uVar8;
        }
        else {
          lVar6 = (nAmount & 0xffffffff) + (ulong)uVar7;
          puVar13[lVar6 + 1] = (uchar)local_48;
          puVar13[lVar6] = (uchar)(local_48 >> 8);
          puVar13[lVar6 + 3] = (uchar)(uVar8 - uVar11);
          puVar13[lVar6 + 2] = (uchar)(uVar8 - uVar11 >> 8);
          puVar13 = pPage->pRaw->zData;
          local_48 = (sVar1 + (short)lVar6) - (short)puVar13;
        }
        if (puVar4 == (ushort *)0x0) {
          (pPage->sHdr).iFree = local_48;
          puVar13[3] = (uchar)local_48;
          puVar4 = (ushort *)(puVar13 + 2);
        }
        else {
          *(uchar *)((long)puVar4 + 1) = (uchar)local_48;
        }
        *(char *)puVar4 = (char)(local_48 >> 8);
        pPage->nFree = pPage->nFree - (short)nAmount;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int lhAllocateSpace(lhpage *pPage,sxu64 nAmount,sxu16 *pOfft)
{
	const unsigned char *zEnd,*zPtr;
	sxu16 iNext,iBlksz,nByte;
	unsigned char *zPrev;
	int rc;
	if( (sxu64)pPage->nFree < nAmount ){
		/* Don't bother looking for a free chunk */
		return UNQLITE_FULL;
	}
	if( pPage->nCell < 10 && ((int)nAmount >= (pPage->pHash->iPageSize / 2)) ){
		/* Big chunk need an overflow page for its data */
		return UNQLITE_FULL;
	}
	zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
	zEnd = &pPage->pRaw->zData[pPage->pHash->iPageSize];
	nByte = (sxu16)nAmount;
	zPrev = 0;
	iBlksz = 0; /* cc warning */
	/* Perform the lookup */
	for(;;){
		if( zPtr >= zEnd ){
			return UNQLITE_FULL;
		}
		/* Offset of the next free block */
		SyBigEndianUnpack16(zPtr,&iNext);
		/* Block size */
		SyBigEndianUnpack16(&zPtr[2],&iBlksz);
		if( iBlksz >= nByte ){
			/* Got one */
			break;
		}
		zPrev = (unsigned char *)zPtr;
		if( iNext == 0 ){
			/* No more free blocks, defragment the page */
			rc = lhPageDefragment(pPage);
			if( rc == UNQLITE_OK && pPage->nFree >= nByte) {
				/* Free blocks are merged together */
				iNext = 0;
				zPtr = &pPage->pRaw->zData[pPage->sHdr.iFree];
				iBlksz = pPage->nFree;
				zPrev = 0;
				break;
			}else{
				return UNQLITE_FULL;
			}
		}
		/* Point to the next free block */
		zPtr = &pPage->pRaw->zData[iNext];
	}
	/* Acquire writer lock on this page */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Save block offset */
	*pOfft = (sxu16)(zPtr - pPage->pRaw->zData);
	/* Fix pointers */
	if( iBlksz >= nByte && (iBlksz - nByte) > 3 ){
		unsigned char *zBlock = &pPage->pRaw->zData[(*pOfft) + nByte];
		/* Create a new block */
		zPtr = zBlock;
		SyBigEndianPack16(zBlock,iNext); /* Offset of the next block */
		SyBigEndianPack16(&zBlock[2],iBlksz-nByte); /* Block size*/
		/* Offset of the new block */
		iNext = (sxu16)(zPtr - pPage->pRaw->zData);
		iBlksz = nByte;
	}
	/* Fix offsets */
	if( zPrev ){
		SyBigEndianPack16(zPrev,iNext);
	}else{
		/* First block */
		pPage->sHdr.iFree = iNext;
		/* Reflect on the page header */
		SyBigEndianPack16(&pPage->pRaw->zData[2/* Offset of the first cell1*/],iNext);
	}
	/* All done */
	pPage->nFree -= iBlksz;
	return UNQLITE_OK;
}